

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

void IntraChromaPreds_C(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [13];
  undefined1 auVar22 [13];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [13];
  undefined1 auVar29 [13];
  undefined1 auVar30 [13];
  undefined1 auVar31 [13];
  undefined1 auVar32 [13];
  undefined1 auVar33 [13];
  undefined1 auVar34 [13];
  undefined1 auVar35 [13];
  undefined1 auVar36 [13];
  undefined1 auVar37 [13];
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [13];
  undefined1 auVar41 [13];
  undefined1 auVar42 [13];
  undefined1 auVar43 [13];
  uint5 uVar44;
  undefined1 auVar45 [13];
  undefined1 auVar46 [13];
  undefined1 auVar47 [13];
  undefined1 auVar48 [13];
  undefined1 auVar49 [13];
  undefined1 auVar50 [13];
  undefined1 auVar51 [13];
  undefined1 auVar52 [13];
  uint uVar53;
  uint *puVar54;
  long *plVar55;
  int j;
  long lVar56;
  uint8_t *puVar57;
  int j_2;
  uint *puVar58;
  long lVar59;
  int iVar60;
  
  if (top == (uint8_t *)0x0) {
    if (left == (uint8_t *)0x0) {
      uVar53 = 0x80;
    }
    else {
      uVar53 = *(uint *)left;
      auVar18[0xc] = (char)(uVar53 >> 0x18);
      auVar18._0_12_ = ZEXT712(0);
      uVar44 = CONCAT32(auVar18._10_3_,(ushort)(byte)(uVar53 >> 0x10));
      auVar51._5_8_ = 0;
      auVar51._0_5_ = uVar44;
      uVar4 = *(undefined4 *)(left + 4);
      uVar38 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar38;
      auVar19[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar20[8] = (char)((uint)uVar4 >> 0x10);
      auVar20._0_8_ = uVar38;
      auVar20[9] = 0;
      auVar20._10_3_ = auVar19._10_3_;
      auVar45._5_8_ = 0;
      auVar45._0_5_ = auVar20._8_5_;
      auVar21[4] = (char)((uint)uVar4 >> 8);
      auVar21._0_4_ = (int)uVar38;
      auVar21[5] = 0;
      auVar21._6_7_ = SUB137(auVar45 << 0x40,6);
      uVar53 = ((uint)(uint3)(auVar19._10_3_ >> 0x10) + (uint)(uint3)(auVar18._10_3_ >> 0x10) +
                auVar21._4_4_ + (int)CONCAT72(SUB137(auVar51 << 0x40,6),(ushort)(byte)(uVar53 >> 8))
               + auVar20._8_4_ + (int)uVar44 + (int)uVar38 + (uVar53 & 0xff)) * 2 + 8 >> 4;
    }
  }
  else {
    uVar4 = *(undefined4 *)top;
    uVar38 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
    auVar6._8_4_ = 0;
    auVar6._0_8_ = uVar38;
    auVar6[0xc] = (char)((uint)uVar4 >> 0x18);
    auVar7[8] = (char)((uint)uVar4 >> 0x10);
    auVar7._0_8_ = uVar38;
    auVar7[9] = 0;
    auVar7._10_3_ = auVar6._10_3_;
    auVar40._5_8_ = 0;
    auVar40._0_5_ = auVar7._8_5_;
    auVar8[4] = (char)((uint)uVar4 >> 8);
    auVar8._0_4_ = (int)uVar38;
    auVar8[5] = 0;
    auVar8._6_7_ = SUB137(auVar40 << 0x40,6);
    uVar4 = *(undefined4 *)(top + 4);
    uVar39 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar39;
    auVar9[0xc] = (char)((uint)uVar4 >> 0x18);
    auVar10[8] = (char)((uint)uVar4 >> 0x10);
    auVar10._0_8_ = uVar39;
    auVar10[9] = 0;
    auVar10._10_3_ = auVar9._10_3_;
    auVar41._5_8_ = 0;
    auVar41._0_5_ = auVar10._8_5_;
    auVar11[4] = (char)((uint)uVar4 >> 8);
    auVar11._0_4_ = (int)uVar39;
    auVar11[5] = 0;
    auVar11._6_7_ = SUB137(auVar41 << 0x40,6);
    iVar60 = (uint)(uint3)(auVar9._10_3_ >> 0x10) + (uint)(uint3)(auVar6._10_3_ >> 0x10) +
             auVar11._4_4_ + auVar8._4_4_ + auVar10._8_4_ + auVar7._8_4_ + (int)uVar39 + (int)uVar38
    ;
    if (left == (uint8_t *)0x0) {
      iVar60 = iVar60 * 2;
    }
    else {
      uVar4 = *(undefined4 *)left;
      uVar38 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar38;
      auVar12[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar13[8] = (char)((uint)uVar4 >> 0x10);
      auVar13._0_8_ = uVar38;
      auVar13[9] = 0;
      auVar13._10_3_ = auVar12._10_3_;
      auVar42._5_8_ = 0;
      auVar42._0_5_ = auVar13._8_5_;
      auVar14[4] = (char)((uint)uVar4 >> 8);
      auVar14._0_4_ = (int)uVar38;
      auVar14[5] = 0;
      auVar14._6_7_ = SUB137(auVar42 << 0x40,6);
      uVar4 = *(undefined4 *)(left + 4);
      uVar39 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
      auVar15._8_4_ = 0;
      auVar15._0_8_ = uVar39;
      auVar15[0xc] = (char)((uint)uVar4 >> 0x18);
      auVar16[8] = (char)((uint)uVar4 >> 0x10);
      auVar16._0_8_ = uVar39;
      auVar16[9] = 0;
      auVar16._10_3_ = auVar15._10_3_;
      auVar43._5_8_ = 0;
      auVar43._0_5_ = auVar16._8_5_;
      auVar17[4] = (char)((uint)uVar4 >> 8);
      auVar17._0_4_ = (int)uVar39;
      auVar17[5] = 0;
      auVar17._6_7_ = SUB137(auVar43 << 0x40,6);
      iVar60 = (uint)(uint3)(auVar15._10_3_ >> 0x10) + (uint)(uint3)(auVar12._10_3_ >> 0x10) +
               auVar17._4_4_ + auVar14._4_4_ +
               auVar16._8_4_ + auVar13._8_4_ + (int)uVar39 + (int)uVar38 + iVar60;
    }
    uVar53 = iVar60 + 8 >> 4;
  }
  lVar56 = 0;
  do {
    *(ulong *)(dst + lVar56 + 0x400) = (ulong)(uVar53 & 0xff) * 0x101010101010101;
    lVar56 = lVar56 + 0x20;
  } while (lVar56 != 0x100);
  if (top == (uint8_t *)0x0) {
    lVar56 = 0;
    do {
      builtin_memcpy(dst + lVar56 + 0x500,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
  }
  else {
    lVar56 = 0;
    do {
      *(undefined8 *)(dst + lVar56 + 0x500) = *(undefined8 *)top;
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
  }
  plVar55 = (long *)(dst + 0x510);
  if (left == (uint8_t *)0x0) {
    lVar56 = 0;
    do {
      puVar57 = (uint8_t *)((long)plVar55 + lVar56);
      puVar57[0] = 0x81;
      puVar57[1] = 0x81;
      puVar57[2] = 0x81;
      puVar57[3] = 0x81;
      puVar57[4] = 0x81;
      puVar57[5] = 0x81;
      puVar57[6] = 0x81;
      puVar57[7] = 0x81;
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
    lVar56 = 0;
    if (top == (uint8_t *)0x0) {
      do {
        puVar57 = dst + lVar56 + 0x410;
        puVar57[0] = 0x81;
        puVar57[1] = 0x81;
        puVar57[2] = 0x81;
        puVar57[3] = 0x81;
        puVar57[4] = 0x81;
        puVar57[5] = 0x81;
        puVar57[6] = 0x81;
        puVar57[7] = 0x81;
        lVar56 = lVar56 + 0x20;
      } while (lVar56 != 0x100);
      goto LAB_00129d91;
    }
    do {
      *(undefined8 *)(dst + lVar56 + 0x410) = *(undefined8 *)top;
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
LAB_00129d3f:
    puVar57 = top + 8;
    if (top == (uint8_t *)0x0) {
      puVar57 = top;
    }
    puVar58 = (uint *)(left + 0x10);
    if (left == (uint8_t *)0x0) {
      puVar58 = (uint *)left;
    }
  }
  else {
    lVar56 = 0;
    do {
      *plVar55 = (ulong)left[lVar56] * 0x101010101010101;
      lVar56 = lVar56 + 1;
      plVar55 = plVar55 + 4;
    } while (lVar56 != 8);
    plVar55 = (long *)(dst + 0x410);
    if (top != (uint8_t *)0x0) {
      bVar2 = left[-1];
      lVar56 = 0;
      do {
        bVar3 = left[lVar56];
        lVar59 = 0;
        do {
          *(uint8_t *)((long)plVar55 + lVar59) =
               clip1[(ulong)top[lVar59] + (ulong)bVar3 + (0xff - (ulong)bVar2)];
          lVar59 = lVar59 + 1;
        } while (lVar59 != 8);
        plVar55 = plVar55 + 4;
        lVar56 = lVar56 + 1;
      } while (lVar56 != 8);
      goto LAB_00129d3f;
    }
    lVar56 = 0;
    do {
      *plVar55 = (ulong)left[lVar56] * 0x101010101010101;
      lVar56 = lVar56 + 1;
      plVar55 = plVar55 + 4;
    } while (lVar56 != 8);
LAB_00129d91:
    puVar57 = top + 8;
    puVar54 = (uint *)(left + 0x10);
    puVar58 = puVar54;
    if (left == (uint8_t *)0x0) {
      puVar58 = (uint *)left;
    }
    if (top == (uint8_t *)0x0) {
      if (left == (uint8_t *)0x0) {
        uVar53 = 0x80;
        puVar54 = (uint *)0x0;
        puVar57 = (uint8_t *)0x0;
      }
      else {
        uVar53 = *puVar58;
        auVar34[0xc] = (char)(uVar53 >> 0x18);
        auVar34._0_12_ = ZEXT712(0);
        uVar44 = CONCAT32(auVar34._10_3_,(ushort)(byte)(uVar53 >> 0x10));
        auVar52._5_8_ = 0;
        auVar52._0_5_ = uVar44;
        uVar5 = puVar58[1];
        uVar38 = (ulong)(ushort)uVar5 & 0xffffffffffff00ff;
        auVar35._8_4_ = 0;
        auVar35._0_8_ = uVar38;
        auVar35[0xc] = (char)(uVar5 >> 0x18);
        auVar36[8] = (char)(uVar5 >> 0x10);
        auVar36._0_8_ = uVar38;
        auVar36[9] = 0;
        auVar36._10_3_ = auVar35._10_3_;
        auVar50._5_8_ = 0;
        auVar50._0_5_ = auVar36._8_5_;
        auVar37[4] = (char)(uVar5 >> 8);
        auVar37._0_4_ = (int)uVar38;
        auVar37[5] = 0;
        auVar37._6_7_ = SUB137(auVar50 << 0x40,6);
        uVar53 = ((uint)(uint3)(auVar35._10_3_ >> 0x10) + (uint)(uint3)(auVar34._10_3_ >> 0x10) +
                  auVar37._4_4_ +
                  (int)CONCAT72(SUB137(auVar52 << 0x40,6),(ushort)(byte)(uVar53 >> 8)) +
                 auVar36._8_4_ + (int)uVar44 + (int)uVar38 + (uVar53 & 0xff)) * 2 + 8 >> 4;
        puVar57 = top;
      }
      goto LAB_00129e49;
    }
  }
  puVar54 = puVar58;
  uVar4 = *(undefined4 *)puVar57;
  uVar38 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
  auVar22._8_4_ = 0;
  auVar22._0_8_ = uVar38;
  auVar22[0xc] = (char)((uint)uVar4 >> 0x18);
  auVar23[8] = (char)((uint)uVar4 >> 0x10);
  auVar23._0_8_ = uVar38;
  auVar23[9] = 0;
  auVar23._10_3_ = auVar22._10_3_;
  auVar46._5_8_ = 0;
  auVar46._0_5_ = auVar23._8_5_;
  auVar24[4] = (char)((uint)uVar4 >> 8);
  auVar24._0_4_ = (int)uVar38;
  auVar24[5] = 0;
  auVar24._6_7_ = SUB137(auVar46 << 0x40,6);
  uVar4 = *(undefined4 *)(puVar57 + 4);
  uVar39 = (ulong)(ushort)uVar4 & 0xffffffffffff00ff;
  auVar25._8_4_ = 0;
  auVar25._0_8_ = uVar39;
  auVar25[0xc] = (char)((uint)uVar4 >> 0x18);
  auVar26[8] = (char)((uint)uVar4 >> 0x10);
  auVar26._0_8_ = uVar39;
  auVar26[9] = 0;
  auVar26._10_3_ = auVar25._10_3_;
  auVar47._5_8_ = 0;
  auVar47._0_5_ = auVar26._8_5_;
  auVar27[4] = (char)((uint)uVar4 >> 8);
  auVar27._0_4_ = (int)uVar39;
  auVar27[5] = 0;
  auVar27._6_7_ = SUB137(auVar47 << 0x40,6);
  iVar60 = (uint)(uint3)(auVar25._10_3_ >> 0x10) + (uint)(uint3)(auVar22._10_3_ >> 0x10) +
           auVar27._4_4_ + auVar24._4_4_ + auVar26._8_4_ + auVar23._8_4_ + (int)uVar39 + (int)uVar38
  ;
  if (left == (uint8_t *)0x0) {
    iVar60 = iVar60 * 2;
  }
  else {
    uVar53 = *puVar54;
    uVar38 = (ulong)(ushort)uVar53 & 0xffffffffffff00ff;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = uVar38;
    auVar28[0xc] = (char)(uVar53 >> 0x18);
    auVar29[8] = (char)(uVar53 >> 0x10);
    auVar29._0_8_ = uVar38;
    auVar29[9] = 0;
    auVar29._10_3_ = auVar28._10_3_;
    auVar48._5_8_ = 0;
    auVar48._0_5_ = auVar29._8_5_;
    auVar30[4] = (char)(uVar53 >> 8);
    auVar30._0_4_ = (int)uVar38;
    auVar30[5] = 0;
    auVar30._6_7_ = SUB137(auVar48 << 0x40,6);
    uVar53 = puVar54[1];
    uVar39 = (ulong)(ushort)uVar53 & 0xffffffffffff00ff;
    auVar31._8_4_ = 0;
    auVar31._0_8_ = uVar39;
    auVar31[0xc] = (char)(uVar53 >> 0x18);
    auVar32[8] = (char)(uVar53 >> 0x10);
    auVar32._0_8_ = uVar39;
    auVar32[9] = 0;
    auVar32._10_3_ = auVar31._10_3_;
    auVar49._5_8_ = 0;
    auVar49._0_5_ = auVar32._8_5_;
    auVar33[4] = (char)(uVar53 >> 8);
    auVar33._0_4_ = (int)uVar39;
    auVar33[5] = 0;
    auVar33._6_7_ = SUB137(auVar49 << 0x40,6);
    iVar60 = (uint)(uint3)(auVar31._10_3_ >> 0x10) + (uint)(uint3)(auVar28._10_3_ >> 0x10) +
             auVar33._4_4_ + auVar30._4_4_ +
             auVar32._8_4_ + auVar29._8_4_ + (int)uVar39 + (int)uVar38 + iVar60;
  }
  uVar53 = iVar60 + 8 >> 4;
LAB_00129e49:
  lVar56 = 0;
  do {
    *(ulong *)(dst + lVar56 + 0x408) = (ulong)(uVar53 & 0xff) * 0x101010101010101;
    lVar56 = lVar56 + 0x20;
  } while (lVar56 != 0x100);
  if (top == (uint8_t *)0x0) {
    lVar56 = 0;
    do {
      builtin_memcpy(dst + lVar56 + 0x508,"\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",8);
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
  }
  else {
    lVar56 = 0;
    do {
      *(undefined8 *)(dst + lVar56 + 0x508) = *(undefined8 *)puVar57;
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
  }
  plVar55 = (long *)(dst + 0x518);
  if (left == (uint8_t *)0x0) {
    lVar56 = 0;
    do {
      puVar1 = (uint8_t *)((long)plVar55 + lVar56);
      puVar1[0] = 0x81;
      puVar1[1] = 0x81;
      puVar1[2] = 0x81;
      puVar1[3] = 0x81;
      puVar1[4] = 0x81;
      puVar1[5] = 0x81;
      puVar1[6] = 0x81;
      puVar1[7] = 0x81;
      lVar56 = lVar56 + 0x20;
    } while (lVar56 != 0x100);
  }
  else {
    lVar56 = 0;
    do {
      *plVar55 = (ulong)*(byte *)((long)puVar54 + lVar56) * 0x101010101010101;
      lVar56 = lVar56 + 1;
      plVar55 = plVar55 + 4;
    } while (lVar56 != 8);
  }
  plVar55 = (long *)(dst + 0x418);
  if (left == (uint8_t *)0x0) {
    if (top == (uint8_t *)0x0) {
      lVar56 = 0;
      do {
        *(undefined8 *)((long)plVar55 + lVar56) = 0x8181818181818181;
        lVar56 = lVar56 + 0x20;
      } while (lVar56 != 0x100);
    }
    else {
      lVar56 = 0;
      do {
        *(undefined8 *)((long)plVar55 + lVar56) = *(undefined8 *)puVar57;
        lVar56 = lVar56 + 0x20;
      } while (lVar56 != 0x100);
    }
  }
  else if (top == (uint8_t *)0x0) {
    lVar56 = 0;
    do {
      *plVar55 = (ulong)*(byte *)((long)puVar54 + lVar56) * 0x101010101010101;
      lVar56 = lVar56 + 1;
      plVar55 = plVar55 + 4;
    } while (lVar56 != 8);
  }
  else {
    bVar2 = *(byte *)((long)puVar54 + -1);
    lVar56 = 0;
    do {
      bVar3 = *(byte *)((long)puVar54 + lVar56);
      lVar59 = 0;
      do {
        *(uint8_t *)((long)plVar55 + lVar59) =
             clip1[(ulong)puVar57[lVar59] + (ulong)bVar3 + (0xff - (ulong)bVar2)];
        lVar59 = lVar59 + 1;
      } while (lVar59 != 8);
      plVar55 = plVar55 + 4;
      lVar56 = lVar56 + 1;
    } while (lVar56 != 8);
  }
  return;
}

Assistant:

static WEBP_INLINE void DCMode(uint8_t* dst, const uint8_t* left,
                               const uint8_t* top,
                               int size, int round, int shift) {
  int DC = 0;
  int j;
  if (top != NULL) {
    for (j = 0; j < size; ++j) DC += top[j];
    if (left != NULL) {   // top and left present
      for (j = 0; j < size; ++j) DC += left[j];
    } else {      // top, but no left
      DC += DC;
    }
    DC = (DC + round) >> shift;
  } else if (left != NULL) {   // left but no top
    for (j = 0; j < size; ++j) DC += left[j];
    DC += DC;
    DC = (DC + round) >> shift;
  } else {   // no top, no left, nothing.
    DC = 0x80;
  }
  Fill(dst, DC, size);
}